

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExecuteInstruction.cpp
# Opt level: O2

int do_int(void)

{
  char cVar1;
  uint uVar2;
  clock_t cVar3;
  undefined4 *puVar4;
  
  cVar1 = (char)registe_ptr->R0;
  if (cVar1 == '\x02') {
    is_clock = true;
    cVar3 = clock();
    clock_begin = (int)cVar3;
  }
  else {
    if (cVar1 == '\x10') {
      uVar2 = printf("%s",data_ptr + registe_ptr->R3);
    }
    else if (cVar1 == '\x11') {
      uVar2 = __isoc99_scanf("%s",data_ptr + registe_ptr->R3,registe_ptr->R4);
    }
    else {
      if (cVar1 != '\x12') {
        if (cVar1 == '0') {
          ret_value = registe_ptr->R1;
        }
        else {
          if (cVar1 != '1') {
            if (cVar1 != '@') {
              return 1;
            }
            if (is_clock) {
              cVar3 = clock();
              clock_end = (int)cVar3;
            }
            kill_module(current_module_id);
            exit(0);
          }
          ret_value_pointer = data_ptr + registe_ptr->R1;
        }
        puVar4 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar4 = 2;
        __cxa_throw(puVar4,&int::typeinfo,0);
      }
      uVar2 = printf("%d",(ulong)*(uint *)(data_ptr + registe_ptr->R3));
    }
    registe_ptr->R0 = uVar2;
  }
  return 1;
}

Assistant:

int do_int() {
	switch ((char)registe_ptr->R0){
	case LVM_CLOCK: {
		is_clock = true;
		clock_begin = clock();
		break;
	}
	case LVM_PRINT: {
		int temp{ 0 };
		temp=printf("%s", data_ptr + registe_ptr->R3);
		registe_ptr->R0 = temp;
		break;
	}
	case LVM_PRINTD: {
		int temp{ 0 };
		temp = printf("%d", *(unsigned*)(data_ptr + registe_ptr->R3));
		registe_ptr->R0 = temp;
		break;
	}
	case LVM_SETRET:{
	    ret_value = registe_ptr->R1;
        throw LVM_RET_HOST;
	}
	case LVM_SETRETPOINTER:{
	    ret_value_pointer = (void*)(data_ptr+registe_ptr->R1);
        throw LVM_RET_HOST;
	}
	case LVM_EXIT: {
		if (is_clock) {
			clock_end = clock();
#ifdef _WIN32
			printf("\nRunning Time：%dms\n", clock_end-clock_begin);
#elif __APPLE__
            printf("\nRunning Time：%dms\n", (clock_end-clock_begin)/1000);
#endif
		}
		kill_module(current_module_id);
		exit(0);
	}
	case LVM_SCAN: {
		int temp{ 0 };
		temp=scanf("%s", data_ptr + registe_ptr->R3,registe_ptr->R4);
		registe_ptr->R0 = temp;
		break;
	}
	}
	return LVM_SUCCESS;
}